

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opengl3.cpp
# Opt level: O3

void ImGui_ImplOpenGL3_RenderDrawData(ImDrawData *draw_data)

{
  undefined8 uVar1;
  GLsizei GVar2;
  ImDrawList *pIVar3;
  ImDrawCmd *pIVar4;
  code *pcVar5;
  undefined1 auVar6 [16];
  void *pvVar7;
  GLboolean GVar8;
  GLboolean GVar9;
  GLboolean GVar10;
  GLboolean GVar11;
  undefined4 in_EAX;
  int iVar12;
  uint uVar13;
  PFNGLENABLEPROC *pp_Var14;
  long lVar15;
  long lVar16;
  long lVar17;
  PFNGLENABLEPROC *pp_Var18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  GLuint vertex_array_object;
  GLenum last_blend_equation_alpha;
  GLenum last_blend_equation_rgb;
  GLenum last_blend_dst_alpha;
  GLenum last_blend_src_alpha;
  GLenum last_blend_dst_rgb;
  GLenum last_blend_src_rgb;
  GLint last_vertex_array_object;
  GLint last_array_buffer;
  GLint last_sampler;
  GLint last_texture;
  GLint last_program;
  GLenum last_active_texture;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLint last_polygon_mode [2];
  GLuint local_e0;
  float local_dc;
  GLenum local_d8;
  GLenum local_d4;
  GLenum local_d0;
  GLenum local_cc;
  GLenum local_c8;
  GLenum local_c4;
  GLuint local_c0;
  GLuint local_bc;
  GLuint local_b8;
  GLuint local_b4;
  GLuint local_b0;
  GLenum local_ac;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  GLint local_98;
  GLint local_94;
  GLsizei local_90;
  GLsizei local_8c;
  GLint local_88;
  GLint local_84;
  GLsizei local_80;
  GLsizei local_7c;
  GLenum local_70 [2];
  ImVec2 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  fVar23 = (float)(int)((draw_data->FramebufferScale).x * (draw_data->DisplaySize).x);
  fVar25 = (float)(int)((draw_data->FramebufferScale).y * (draw_data->DisplaySize).y);
  auVar21._0_4_ = -(uint)(0 < (int)fVar23);
  auVar21._4_4_ = -(uint)(0 < (int)fVar23);
  auVar21._8_4_ = -(uint)(0 < (int)fVar25);
  auVar21._12_4_ = -(uint)(0 < (int)fVar25);
  iVar12 = movmskpd(in_EAX,auVar21);
  if (iVar12 == 3) {
    local_a8.y = fVar25;
    local_a8.x = fVar23;
    uStack_a0 = 0;
    (*glad_glGetIntegerv)(0x84e0,(GLint *)&local_ac);
    (*glad_glActiveTexture)(0x84c0);
    (*glad_glGetIntegerv)(0x8b8d,(GLint *)&local_b0);
    (*glad_glGetIntegerv)(0x8069,(GLint *)&local_b4);
    (*glad_glGetIntegerv)(0x8919,(GLint *)&local_b8);
    (*glad_glGetIntegerv)(0x8894,(GLint *)&local_bc);
    (*glad_glGetIntegerv)(0x85b5,(GLint *)&local_c0);
    (*glad_glGetIntegerv)(0xb40,(GLint *)local_70);
    (*glad_glGetIntegerv)(0xba2,&local_88);
    (*glad_glGetIntegerv)(0xc10,&local_98);
    (*glad_glGetIntegerv)(0x80c9,(GLint *)&local_c4);
    (*glad_glGetIntegerv)(0x80c8,(GLint *)&local_c8);
    (*glad_glGetIntegerv)(0x80cb,(GLint *)&local_cc);
    (*glad_glGetIntegerv)(0x80ca,(GLint *)&local_d0);
    (*glad_glGetIntegerv)(0x8009,(GLint *)&local_d4);
    (*glad_glGetIntegerv)(0x883d,(GLint *)&local_d8);
    GVar8 = (*glad_glIsEnabled)(0xbe2);
    GVar9 = (*glad_glIsEnabled)(0xb44);
    GVar10 = (*glad_glIsEnabled)(0xb71);
    GVar11 = (*glad_glIsEnabled)(0xc11);
    local_e0 = 0;
    (*glad_glGenVertexArrays)(1,&local_e0);
    fVar23 = local_a8.x;
    fVar25 = local_a8.y;
    ImGui_ImplOpenGL3_SetupRenderState(draw_data,(int)local_a8.x,(int)local_a8.y,local_e0);
    if (0 < draw_data->CmdListsCount) {
      local_dc = (float)(int)fVar23;
      fVar19 = (float)(int)fVar25;
      local_a8 = draw_data->DisplayPos;
      local_68 = draw_data->FramebufferScale;
      local_48 = local_68.y;
      uStack_60 = 0;
      uStack_a0 = 0;
      local_58 = local_a8.y;
      lVar16 = 0;
      fStack_54 = local_58;
      fStack_50 = local_58;
      fStack_4c = local_58;
      fStack_44 = local_48;
      fStack_40 = local_48;
      fStack_3c = local_48;
      do {
        pIVar3 = draw_data->CmdLists[lVar16];
        (*glad_glBufferData)
                  (0x8892,(long)(pIVar3->VtxBuffer).Size * 0x14,(pIVar3->VtxBuffer).Data,0x88e0);
        (*glad_glBufferData)
                  (0x8893,(long)(pIVar3->IdxBuffer).Size * 2,(pIVar3->IdxBuffer).Data,0x88e0);
        if (0 < (pIVar3->CmdBuffer).Size) {
          lVar15 = 0;
          lVar17 = 0;
          do {
            pIVar4 = (pIVar3->CmdBuffer).Data;
            pcVar5 = *(code **)((long)&pIVar4->UserCallback + lVar15);
            if (pcVar5 == (code *)0x0) {
              fVar20 = (*(float *)((long)&(pIVar4->ClipRect).x + lVar15) - local_a8.x) * local_68.x;
              if ((fVar20 < local_dc) &&
                 (fVar22 = (*(float *)((long)&(pIVar4->ClipRect).y + lVar15) - local_58) * local_48,
                 fVar22 < fVar19)) {
                uVar1 = *(undefined8 *)((long)&(pIVar4->ClipRect).z + lVar15);
                fVar24 = ((float)uVar1 - local_a8.x) * local_68.x;
                fVar26 = ((float)((ulong)uVar1 >> 0x20) - local_a8.y) * local_68.y;
                iVar12 = -(uint)(0.0 <= fVar24);
                auVar6._4_4_ = iVar12;
                auVar6._0_4_ = iVar12;
                auVar6._8_4_ = -(uint)(0.0 <= fVar26);
                auVar6._12_4_ = -(uint)(0.0 <= fVar26);
                uVar13 = movmskpd(0,auVar6);
                if (((uVar13 & 1) != 0) && ((byte)((byte)uVar13 >> 1) != 0)) {
                  (*glad_glScissor)((int)fVar20,(int)(fVar19 - fVar26),(int)(fVar24 - fVar20),
                                    (int)(fVar26 - fVar22));
                  (*glad_glBindTexture)(0xde1,*(GLuint *)((long)&pIVar4->TextureId + lVar15));
                  GVar2 = *(GLsizei *)((long)&pIVar4->ElemCount + lVar15);
                  pvVar7 = (void *)((ulong)*(uint *)((long)&pIVar4->IdxOffset + lVar15) * 2);
                  if (g_GlVersion < 0x140) {
                    (*glad_glDrawElements)(4,GVar2,0x1403,pvVar7);
                  }
                  else {
                    (*glad_glDrawElementsBaseVertex)
                              (4,GVar2,0x1403,pvVar7,*(GLint *)((long)&pIVar4->VtxOffset + lVar15));
                  }
                }
              }
            }
            else if (pcVar5 == (code *)0xffffffffffffffff) {
              ImGui_ImplOpenGL3_SetupRenderState(draw_data,(int)fVar23,(int)fVar25,local_e0);
            }
            else {
              (*pcVar5)(pIVar3,(long)&pIVar4->ElemCount + lVar15);
            }
            lVar17 = lVar17 + 1;
            lVar15 = lVar15 + 0x38;
          } while (lVar17 < (pIVar3->CmdBuffer).Size);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < draw_data->CmdListsCount);
    }
    (*glad_glDeleteVertexArrays)(1,&local_e0);
    (*glad_glUseProgram)(local_b0);
    (*glad_glBindTexture)(0xde1,local_b4);
    (*glad_glBindSampler)(0,local_b8);
    (*glad_glActiveTexture)(local_ac);
    (*glad_glBindVertexArray)(local_c0);
    (*glad_glBindBuffer)(0x8892,local_bc);
    (*glad_glBlendEquationSeparate)(local_d4,local_d8);
    (*glad_glBlendFuncSeparate)(local_c4,local_c8,local_cc,local_d0);
    pp_Var18 = &glad_glEnable;
    pp_Var14 = &glad_glEnable;
    if (GVar8 == '\0') {
      pp_Var14 = &glad_glDisable;
    }
    (**pp_Var14)(0xbe2);
    pp_Var14 = &glad_glEnable;
    if (GVar9 == '\0') {
      pp_Var14 = &glad_glDisable;
    }
    (**pp_Var14)(0xb44);
    pp_Var14 = &glad_glEnable;
    if (GVar10 == '\0') {
      pp_Var14 = &glad_glDisable;
    }
    (**pp_Var14)(0xb71);
    if (GVar11 == '\0') {
      pp_Var18 = &glad_glDisable;
    }
    (**pp_Var18)(0xc11);
    (*glad_glPolygonMode)(0x408,local_70[0]);
    (*glad_glViewport)(local_88,local_84,local_80,local_7c);
    (*glad_glScissor)(local_98,local_94,local_90,local_8c);
  }
  return;
}

Assistant:

void    ImGui_ImplOpenGL3_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width <= 0 || fb_height <= 0)
        return;

    // Backup GL state
    GLenum last_active_texture; glGetIntegerv(GL_ACTIVE_TEXTURE, (GLint*)&last_active_texture);
    glActiveTexture(GL_TEXTURE0);
    GLint last_program; glGetIntegerv(GL_CURRENT_PROGRAM, &last_program);
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
#ifdef GL_SAMPLER_BINDING
    GLint last_sampler; glGetIntegerv(GL_SAMPLER_BINDING, &last_sampler);
#endif
    GLint last_array_buffer; glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_ES2
    GLint last_vertex_array_object; glGetIntegerv(GL_VERTEX_ARRAY_BINDING, &last_vertex_array_object);
#endif
#ifdef GL_POLYGON_MODE
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
#endif
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLenum last_blend_src_rgb; glGetIntegerv(GL_BLEND_SRC_RGB, (GLint*)&last_blend_src_rgb);
    GLenum last_blend_dst_rgb; glGetIntegerv(GL_BLEND_DST_RGB, (GLint*)&last_blend_dst_rgb);
    GLenum last_blend_src_alpha; glGetIntegerv(GL_BLEND_SRC_ALPHA, (GLint*)&last_blend_src_alpha);
    GLenum last_blend_dst_alpha; glGetIntegerv(GL_BLEND_DST_ALPHA, (GLint*)&last_blend_dst_alpha);
    GLenum last_blend_equation_rgb; glGetIntegerv(GL_BLEND_EQUATION_RGB, (GLint*)&last_blend_equation_rgb);
    GLenum last_blend_equation_alpha; glGetIntegerv(GL_BLEND_EQUATION_ALPHA, (GLint*)&last_blend_equation_alpha);
    GLboolean last_enable_blend = glIsEnabled(GL_BLEND);
    GLboolean last_enable_cull_face = glIsEnabled(GL_CULL_FACE);
    GLboolean last_enable_depth_test = glIsEnabled(GL_DEPTH_TEST);
    GLboolean last_enable_scissor_test = glIsEnabled(GL_SCISSOR_TEST);

    // Setup desired GL state
    // Recreate the VAO every time (this is to easily allow multiple GL contexts to be rendered to. VAO are not shared among GL contexts)
    // The renderer would actually work without any VAO bound, but then our VertexAttrib calls would overwrite the default one currently bound.
    GLuint vertex_array_object = 0;
#ifndef IMGUI_IMPL_OPENGL_ES2
    glGenVertexArrays(1, &vertex_array_object);
#endif
    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];

        // Upload vertex/index buffers
        glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)cmd_list->VtxBuffer.Size * sizeof(ImDrawVert), (const GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW);
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)cmd_list->IdxBuffer.Size * sizeof(ImDrawIdx), (const GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW);

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback != NULL)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
#if IMGUI_IMPL_OPENGL_MAY_HAVE_VTX_OFFSET
                    if (g_GlVersion >= 320)
                        glDrawElementsBaseVertex(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)), (GLint)pcmd->VtxOffset);
                    else
#endif
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)));
                }
            }
        }
    }

    // Destroy the temporary VAO
#ifndef IMGUI_IMPL_OPENGL_ES2
    glDeleteVertexArrays(1, &vertex_array_object);
#endif

    // Restore modified GL state
    glUseProgram(last_program);
    glBindTexture(GL_TEXTURE_2D, last_texture);
#ifdef GL_SAMPLER_BINDING
    glBindSampler(0, last_sampler);
#endif
    glActiveTexture(last_active_texture);
#ifndef IMGUI_IMPL_OPENGL_ES2
    glBindVertexArray(last_vertex_array_object);
#endif
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
    glBlendEquationSeparate(last_blend_equation_rgb, last_blend_equation_alpha);
    glBlendFuncSeparate(last_blend_src_rgb, last_blend_dst_rgb, last_blend_src_alpha, last_blend_dst_alpha);
    if (last_enable_blend) glEnable(GL_BLEND); else glDisable(GL_BLEND);
    if (last_enable_cull_face) glEnable(GL_CULL_FACE); else glDisable(GL_CULL_FACE);
    if (last_enable_depth_test) glEnable(GL_DEPTH_TEST); else glDisable(GL_DEPTH_TEST);
    if (last_enable_scissor_test) glEnable(GL_SCISSOR_TEST); else glDisable(GL_SCISSOR_TEST);
#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, (GLenum)last_polygon_mode[0]);
#endif
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
}